

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void notch::core::SGD::train
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Net *net,LabeledDataset *trainSet,int epochs,EpochCallback *epochCallback,
               IterationCallback *sampleCallback)

{
  Dataset *pDVar1;
  LabeledDataset *pLVar2;
  bool bVar3;
  int iVar4;
  int currentEpoch;
  int currentIteration;
  LabeledDataset *__range3;
  DatasetIterator __end3;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  EpochCallback *local_68;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  *local_60;
  LabeledDataset *local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  currentEpoch = 0;
  iVar4 = 0;
  if (0 < epochs) {
    iVar4 = epochs;
  }
  local_68 = epochCallback;
  local_60 = rng;
  local_58 = trainSet;
  while( true ) {
    if (currentEpoch == iVar4) {
      std::function<bool_(int)>::operator()(&local_68->callback,epochs);
      return;
    }
    bVar3 = EpochCallback::operator()(local_68,currentEpoch,false);
    pLVar2 = local_58;
    if (bVar3) break;
    LabeledDataset::shuffle(local_58,local_60);
    pDVar1 = &pLVar2->inputs;
    local_88._0_8_ =
         (pDVar1->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_88._8_8_ =
         (pDVar1->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    pDVar1 = &pLVar2->outputs;
    local_78._0_8_ =
         (pDVar1->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_78._8_8_ =
         (pDVar1->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    local_50._8_4_ = (undefined4)local_88._8_8_;
    local_50._12_4_ = (undefined4)((ulong)local_88._8_8_ >> 0x20);
    local_50._0_8_ = local_88._8_8_;
    local_40._8_4_ = (int)local_78._8_8_;
    local_40._0_8_ = local_78._8_8_;
    local_40._12_4_ = (int)((ulong)local_78._8_8_ >> 0x20);
    currentIteration = 0;
    while (bVar3 = LabeledDataset::DatasetIterator::operator!=
                             ((DatasetIterator *)local_88,(DatasetIterator *)local_50), bVar3) {
      Net::loss(net,(Array *)local_88._0_8_,(Array *)local_78._0_8_);
      Net::backprop(net);
      Net::update(net);
      bVar3 = IterationCallback::operator()(sampleCallback,currentIteration,false);
      if (bVar3) {
        return;
      }
      if (local_88._0_8_ != local_88._8_8_) {
        if (local_78._0_8_ != local_78._8_8_) {
          local_88._0_8_ = (valarray<float> *)(local_88._0_8_ + 0x10);
          local_78._0_8_ = (valarray<float> *)(local_78._0_8_ + 0x10);
        }
      }
      currentIteration = currentIteration + 1;
    }
    currentEpoch = currentEpoch + 1;
  }
  return;
}

Assistant:

static
    void train(std::unique_ptr<RNG> &rng,
            Net &net, LabeledDataset &trainSet, int epochs,
            const EpochCallback &epochCallback = noEpochCallback,
            const IterationCallback &sampleCallback = noIterationCallback) {
        for (int j = 0; j < epochs; ++j) {
            if (epochCallback(j)) {
                return;
            }
            trainSet.shuffle(rng);
            int sampleCounter = 0;
            for (auto sample : trainSet) {
                net.loss(sample.data, sample.label);
                net.backprop();
                net.update();
                if (sampleCallback(sampleCounter)) {
                    return;
                }
                ++sampleCounter;
            }
        }
        epochCallback(epochs, true);
    }